

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O0

void Hacl_Hash_SHA3_shake128_absorb_final(uint64_t *state,uint8_t *input,uint32_t inputByteLen)

{
  uint64_t uVar1;
  uint8_t *b0;
  uint8_t *b3;
  uint8_t b2 [256];
  uint32_t i;
  uint64_t u30;
  uint64_t u29;
  uint64_t u28;
  uint64_t u27;
  uint64_t u26;
  uint64_t u25;
  uint64_t u24;
  uint64_t u23;
  uint64_t u22;
  uint64_t u21;
  uint64_t u20;
  uint64_t u19;
  uint64_t u18;
  uint64_t u17;
  uint64_t u16;
  uint64_t u15;
  uint64_t u14;
  uint64_t u13;
  uint64_t u12;
  uint64_t u11;
  uint64_t u10;
  uint64_t u9;
  uint64_t u8;
  uint64_t u7;
  uint64_t u6;
  uint64_t u5;
  uint64_t u4;
  uint64_t u3;
  uint64_t u2;
  uint64_t u1;
  uint64_t u0;
  uint64_t u;
  uint8_t *b;
  uint64_t ws [32];
  uint8_t *b01;
  uint8_t *bl0;
  uint8_t *b00;
  uint32_t rem;
  uint8_t *b_;
  uint8_t b1 [256];
  uint32_t inputByteLen_local;
  uint8_t *input_local;
  uint64_t *state_local;
  
  memset(&b_,0,0x100);
  memcpy(&b_,input + ((ulong)inputByteLen - (ulong)(inputByteLen % 0xa8)),
         (ulong)(inputByteLen % 0xa8));
  *(uint8_t *)((long)&b_ + (ulong)inputByteLen % 0xa8) = '\x1f';
  memset(&b,0,0x100);
  uVar1 = load64((uint8_t *)&b_);
  b = (uint8_t *)__uint64_identity(uVar1);
  uVar1 = load64(b1);
  ws[0] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 8);
  ws[1] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x10);
  ws[2] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x18);
  ws[3] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x20);
  ws[4] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x28);
  ws[5] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x30);
  ws[6] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x38);
  ws[7] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x40);
  ws[8] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x48);
  ws[9] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x50);
  ws[10] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x58);
  ws[0xb] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x60);
  ws[0xc] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x68);
  ws[0xd] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x70);
  ws[0xe] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x78);
  ws[0xf] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x80);
  ws[0x10] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x88);
  ws[0x11] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x90);
  ws[0x12] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0x98);
  ws[0x13] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xa0);
  ws[0x14] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xa8);
  ws[0x15] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xb0);
  ws[0x16] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xb8);
  ws[0x17] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xc0);
  ws[0x18] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 200);
  ws[0x19] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xd0);
  ws[0x1a] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xd8);
  ws[0x1b] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xe0);
  ws[0x1c] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xe8);
  ws[0x1d] = __uint64_identity(uVar1);
  uVar1 = load64(b1 + 0xf0);
  ws[0x1e] = __uint64_identity(uVar1);
  b2[0xfc] = '\0';
  b2[0xfd] = '\0';
  b2[0xfe] = '\0';
  b2[0xff] = '\0';
  for (; (uint)b2._252_4_ < 0x19; b2._252_4_ = b2._252_4_ + 1) {
    state[(uint)b2._252_4_] = state[(uint)b2._252_4_] ^ ws[(ulong)(uint)b2._252_4_ - 1];
  }
  memset(&b3,0,0x100);
  b2[0x9f] = 0x80;
  Hacl_Hash_SHA3_absorb_inner_32(0xa8,(uint8_t *)&b3,state);
  return;
}

Assistant:

void
Hacl_Hash_SHA3_shake128_absorb_final(uint64_t *state, uint8_t *input, uint32_t inputByteLen)
{
  uint8_t b1[256U] = { 0U };
  uint8_t *b_ = b1;
  uint32_t rem = inputByteLen % 168U;
  uint8_t *b00 = input;
  uint8_t *bl0 = b_;
  memcpy(bl0, b00 + inputByteLen - rem, rem * sizeof (uint8_t));
  uint8_t *b01 = b_;
  b01[inputByteLen % 168U] = 0x1FU;
  uint64_t ws[32U] = { 0U };
  uint8_t *b = b_;
  uint64_t u = load64_le(b);
  ws[0U] = u;
  uint64_t u0 = load64_le(b + 8U);
  ws[1U] = u0;
  uint64_t u1 = load64_le(b + 16U);
  ws[2U] = u1;
  uint64_t u2 = load64_le(b + 24U);
  ws[3U] = u2;
  uint64_t u3 = load64_le(b + 32U);
  ws[4U] = u3;
  uint64_t u4 = load64_le(b + 40U);
  ws[5U] = u4;
  uint64_t u5 = load64_le(b + 48U);
  ws[6U] = u5;
  uint64_t u6 = load64_le(b + 56U);
  ws[7U] = u6;
  uint64_t u7 = load64_le(b + 64U);
  ws[8U] = u7;
  uint64_t u8 = load64_le(b + 72U);
  ws[9U] = u8;
  uint64_t u9 = load64_le(b + 80U);
  ws[10U] = u9;
  uint64_t u10 = load64_le(b + 88U);
  ws[11U] = u10;
  uint64_t u11 = load64_le(b + 96U);
  ws[12U] = u11;
  uint64_t u12 = load64_le(b + 104U);
  ws[13U] = u12;
  uint64_t u13 = load64_le(b + 112U);
  ws[14U] = u13;
  uint64_t u14 = load64_le(b + 120U);
  ws[15U] = u14;
  uint64_t u15 = load64_le(b + 128U);
  ws[16U] = u15;
  uint64_t u16 = load64_le(b + 136U);
  ws[17U] = u16;
  uint64_t u17 = load64_le(b + 144U);
  ws[18U] = u17;
  uint64_t u18 = load64_le(b + 152U);
  ws[19U] = u18;
  uint64_t u19 = load64_le(b + 160U);
  ws[20U] = u19;
  uint64_t u20 = load64_le(b + 168U);
  ws[21U] = u20;
  uint64_t u21 = load64_le(b + 176U);
  ws[22U] = u21;
  uint64_t u22 = load64_le(b + 184U);
  ws[23U] = u22;
  uint64_t u23 = load64_le(b + 192U);
  ws[24U] = u23;
  uint64_t u24 = load64_le(b + 200U);
  ws[25U] = u24;
  uint64_t u25 = load64_le(b + 208U);
  ws[26U] = u25;
  uint64_t u26 = load64_le(b + 216U);
  ws[27U] = u26;
  uint64_t u27 = load64_le(b + 224U);
  ws[28U] = u27;
  uint64_t u28 = load64_le(b + 232U);
  ws[29U] = u28;
  uint64_t u29 = load64_le(b + 240U);
  ws[30U] = u29;
  uint64_t u30 = load64_le(b + 248U);
  ws[31U] = u30;
  for (uint32_t i = 0U; i < 25U; i++)
  {
    state[i] = state[i] ^ ws[i];
  }
  uint8_t b2[256U] = { 0U };
  uint8_t *b3 = b2;
  uint8_t *b0 = b3;
  b0[167U] = 0x80U;
  Hacl_Hash_SHA3_absorb_inner_32(168U, b3, state);
}